

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::CompositeCodec<FastPForLib::PFor2008,_FastPForLib::VariableByte>::
_decodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::PFor2008,_FastPForLib::VariableByte> *this,uint32_t *in,
          size_t length,uint *out,size_t *nvalue)

{
  logic_error *plVar1;
  long lVar2;
  PFor2008 *in_RCX;
  long in_RDX;
  uint32_t *in_RSI;
  VariableByte *in_RDI;
  uint32_t *in_R8;
  uint32_t *in3;
  size_t nvalue2;
  uint32_t *in2;
  size_t mynvalue1;
  uint32_t *initin;
  uint32_t *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  size_t *in_stack_ffffffffffffffb8;
  uint32_t *out_00;
  uint32_t *puVar3;
  uint32_t *local_8;
  
  local_8 = in_RSI;
  if (*(long *)in_R8 != 0) {
    out_00 = *(uint32_t **)in_R8;
    puVar3 = in_RSI;
    local_8 = PFor2008::decodeArray(in_RCX,in_R8,(size_t)in_RSI,out_00,in_stack_ffffffffffffffb8);
    if (local_8 < in_RSI + in_RDX) {
      if (*(uint32_t **)in_R8 <= out_00) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar1,"Buffer contains more data than requested!");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      lVar2 = *(long *)in_R8 - (long)out_00;
      local_8 = VariableByte::decodeArray
                          (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,(size_t *)0x154a19);
      *(long *)in_R8 = (long)out_00 + lVar2;
      if (puVar3 + in_RDX < local_8) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar1,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else {
      *(uint32_t **)in_R8 = out_00;
      if (puVar3 + in_RDX < local_8) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar1,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return local_8;
}

Assistant:

const uint32_t *_decodeArray(const uint32_t *in, const size_t length,
                               IntType *out, size_t &nvalue) {
    if (nvalue == 0) {
      return in;
    }
    const uint32_t *const initin(in);
    size_t mynvalue1 = nvalue;
    const uint32_t *in2 = codec1.decodeArray(in, length, out, mynvalue1);
    if (length + in > in2) {
      if (nvalue <= mynvalue1) {
        throw std::logic_error("Buffer contains more data than requested!");
      }
      size_t nvalue2 = nvalue - mynvalue1;
      const uint32_t *in3 = codec2.decodeArray(in2, length - (in2 - in),
                                               out + mynvalue1, nvalue2);
      nvalue = mynvalue1 + nvalue2;
      if (initin + length < in3) {
        throw std::logic_error(
            "Decode run over output buffer. Potential buffer overflow!");
      }
      return in3;
    }
    nvalue = mynvalue1;
    if (initin + length < in2) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }
    return in2;
  }